

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_accept.c
# Opt level: O0

int mpt_parse_accept(mpt_parser_allow *flg,char *name)

{
  int iVar1;
  ushort **ppuVar2;
  byte local_30;
  byte local_2a;
  byte local_29;
  int type;
  uint8_t opt;
  uint8_t sect;
  char *end;
  char *name_local;
  mpt_parser_allow *flg_local;
  
  local_29 = 0;
  local_2a = 0;
  if (name == (char *)0x0) {
    flg->opt = 0xff;
    flg->sect = 0xff;
    flg_local._4_4_ = 0;
  }
  else {
    _type = name;
    if (*name == '\0') {
      flg->opt = 2;
      flg->sect = 2;
      flg_local._4_4_ = 0;
    }
    else {
      while ((*_type != '\0' && (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*_type] & 0x2000) == 0)
             )) {
        iVar1 = tolower((int)*_type);
        switch(iVar1) {
        case 0x62:
          local_30 = 0x20;
          break;
        case 99:
          local_30 = 2;
          break;
        default:
          return -2;
        case 0x65:
          local_30 = 0x10;
          break;
        case 0x66:
          local_30 = 1;
          break;
        case 0x6e:
          local_30 = 3;
          break;
        case 0x73:
          local_30 = 4;
          break;
        case 0x77:
          local_30 = 8;
        }
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)*_type] & 0x100) == 0) {
          local_2a = local_2a | local_30;
        }
        else {
          local_29 = local_29 | local_30;
        }
        _type = _type + 1;
      }
      flg->sect = (ushort)local_29;
      flg->opt = (ushort)local_2a;
      flg_local._4_4_ = (int)_type - (int)name;
    }
  }
  return flg_local._4_4_;
}

Assistant:

extern int mpt_parse_accept(MPT_STRUCT(parser_allow) *flg, const char *name)
{
	const char *end = name;
	uint8_t sect = 0, opt = 0;
	
	if (!end) {
		flg->sect = flg->opt = 0xff;
		return 0;
	}
	if (!*end) {
		flg->sect = flg->opt = MPT_NAMEFLAG(NumCont);
		return 0;
	}
	while (*end) {
		int type;
		
		if (isspace(*end)) {
			break;
		}
		switch (type = tolower(*end)) {
		  case 'f': type = MPT_NAMEFLAG(NumStart); break;
		  case 'c': type = MPT_NAMEFLAG(NumCont); break;
		  case 'n': type = MPT_NAMEFLAG(Numeral); break;
		  case 's': type = MPT_NAMEFLAG(Special); break;
		  case 'w': type = MPT_NAMEFLAG(Space); break;
		  
		  case 'e': type = MPT_NAMEFLAG(Empty); break;
		  case 'b': type = MPT_NAMEFLAG(Binary); break;
		  default: return -2;
		}
		if (isupper(*end)) {
			sect |= type;
		} else {
			opt |= type;
		}
		++end;
	}
	flg->sect = sect;
	flg->opt  = opt;
	
	return end - name;
}